

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O3

void fsnav_linal_kalman_predict_I(double *S,double *Q,size_t n,size_t m)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  
  fsnav_linal_uuT(S,S,n);
  if (m != 0) {
    lVar1 = n * 2;
    lVar2 = m * 2;
    lVar3 = 0;
    lVar4 = 0;
    sVar6 = 0;
    sVar5 = m;
    do {
      lVar7 = 0;
      do {
        *(double *)((long)S + lVar7 * 8 + lVar3 * 4) =
             *(double *)((long)Q + lVar7 * 8 + lVar4 * 4) +
             *(double *)((long)S + lVar7 * 8 + lVar3 * 4);
        lVar7 = lVar7 + 1;
      } while (sVar5 + (sVar5 == 0) != lVar7);
      sVar6 = sVar6 + 1;
      sVar5 = sVar5 - 1;
      lVar4 = lVar4 + lVar2;
      lVar2 = lVar2 + -2;
      lVar3 = lVar3 + lVar1;
      lVar1 = lVar1 + -2;
    } while (sVar6 != m);
  }
  fsnav_linal_chol(S,S,n);
  return;
}

Assistant:

void fsnav_linal_kalman_predict_I(double* S, double* Q, const size_t n, const size_t m)
{
	size_t i, k0, j, k1;

	fsnav_linal_uuT(S, S, n);      // P = S*S^T
	for (i = 0; i < m; i++) {
		k0 = i*(2*n-i+1)/2;
		k1 = i*(2*m-i+1)/2;
		for (j = 0; j < m-i; j++)
			S[k0+j] += Q[k1+j];   // P = P + [Q 0; 0 0]
	}
	fsnav_linal_chol(S, S, n);     // P = S*S^T
}